

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_8>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *kernel)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  
  pfVar1 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>).m_d.data;
  pfVar2 = (kernel->m_src->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>).m_d.data;
  uVar3 = *(undefined8 *)(pfVar2 + 2);
  *(undefined8 *)pfVar1 = *(undefined8 *)pfVar2;
  *(undefined8 *)(pfVar1 + 2) = uVar3;
  pfVar1 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>).m_d.data;
  pfVar2 = (kernel->m_src->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>).m_d.data;
  uVar3 = *(undefined8 *)(pfVar2 + 6);
  *(undefined8 *)(pfVar1 + 4) = *(undefined8 *)(pfVar2 + 4);
  *(undefined8 *)(pfVar1 + 6) = uVar3;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void assignPacket(Index row, Index col)
  {
    m_functor.template assignPacket<StoreMode>(&m_dst.coeffRef(row,col), m_src.template packet<LoadMode,PacketType>(row,col));
  }